

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

symbol ** Symbol_arrayof(void)

{
  size_t nByte;
  int iVar1;
  s_x2 *psVar2;
  symbol **__s;
  long lVar3;
  
  if (x2a == (s_x2 *)0x0) {
    __s = (symbol **)0x0;
  }
  else {
    iVar1 = x2a->count;
    nByte = (long)iVar1 * 8;
    __s = (symbol **)lemon_malloc(nByte);
    memset(__s,0,nByte);
    psVar2 = x2a;
    if (0 < (long)iVar1) {
      lVar3 = 0;
      do {
        *(undefined8 *)((long)__s + lVar3) = *(undefined8 *)((long)&psVar2->tbl->data + lVar3 * 4);
        lVar3 = lVar3 + 8;
      } while (nByte - lVar3 != 0);
    }
  }
  return __s;
}

Assistant:

struct symbol **Symbol_arrayof()
{
  struct symbol **array;
  int i,arrSize;
  if( x2a==0 ) return 0;
  arrSize = x2a->count;
  array = (struct symbol **)lemon_calloc(arrSize, sizeof(struct symbol *));
  if( array ){
    for(i=0; i<arrSize; i++) array[i] = x2a->tbl[i].data;
  }
  return array;
}